

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

void prvTidyFreeAnchors(TidyDocImpl *doc)

{
  Anchor *pAVar1;
  uint h;
  long lVar2;
  
  lVar2 = 0;
  do {
    while (pAVar1 = (doc->attribs).anchor_hash[lVar2], pAVar1 != (Anchor *)0x0) {
      (doc->attribs).anchor_hash[lVar2] = pAVar1->next;
      (*doc->allocator->vtbl->free)(doc->allocator,pAVar1->name);
      (*doc->allocator->vtbl->free)(doc->allocator,pAVar1);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x3fd);
  return;
}

Assistant:

void TY_(FreeAnchors)( TidyDocImpl* doc )
{
    TidyAttribImpl* attribs = &doc->attribs;
    Anchor* a;
    uint h;
    for (h = 0; h < ANCHOR_HASH_SIZE; h++) {
        while (NULL != (a = attribs->anchor_hash[h]) )
        {
            attribs->anchor_hash[h] = a->next;
            FreeAnchor(doc, a);
        }
    }
}